

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrecord.cpp
# Opt level: O0

void __thiscall QSqlRecord::append(QSqlRecord *this,QSqlField *field)

{
  QList<QSqlField> *in_RSI;
  parameter_type in_RDI;
  
  detach((QSqlRecord *)0x13c140);
  QExplicitlySharedDataPointer<QSqlRecordPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSqlRecordPrivate> *)0x13c149);
  QList<QSqlField>::append(in_RSI,in_RDI);
  return;
}

Assistant:

void QSqlRecord::append(const QSqlField &field)
{
    detach();
    d->fields.append(field);
}